

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache_p.h
# Opt level: O1

void __thiscall QNetworkDiskCachePrivate::~QNetworkDiskCachePrivate(QNetworkDiskCachePrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)&this->super_QAbstractNetworkCachePrivate =
       &PTR__QNetworkDiskCachePrivate_002d2e60;
  QHash<QIODevice_*,_QCacheItem_*>::~QHash(&this->inserting);
  pDVar1 = (this->dataDirectory).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->dataDirectory).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->cacheDirectory).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->cacheDirectory).d.d)->super_QArrayData,2,0x10);
    }
  }
  QCacheItem::~QCacheItem(&this->lastItem);
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

QNetworkDiskCachePrivate()
        : QAbstractNetworkCachePrivate()
        , maximumCacheSize(1024 * 1024 * 50)
        , currentCacheSize(-1)
        {}